

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

FunctionPrototypeSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::FunctionPrototypeSyntax,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::ClassSpecifierSyntax>const&,slang::parsing::Token&,slang::syntax::DataTypeSyntax&,slang::syntax::NameSyntax&,slang::syntax::FunctionPortListSyntax*&>
          (BumpAllocator *this,Token *args,SyntaxList<slang::syntax::ClassSpecifierSyntax> *args_1,
          Token *args_2,DataTypeSyntax *args_3,NameSyntax *args_4,FunctionPortListSyntax **args_5)

{
  Token lifetime;
  Token keyword;
  FunctionPrototypeSyntax *pFVar1;
  Info *in_RCX;
  DataTypeSyntax *in_RSI;
  NameSyntax *in_RDI;
  undefined8 in_R8;
  Info *in_R9;
  FunctionPortListSyntax *unaff_retaddr;
  size_t in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  BumpAllocator *in_stack_ffffffffffffffa8;
  
  pFVar1 = (FunctionPrototypeSyntax *)
           allocate(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  keyword.info = in_RCX;
  keyword.kind = (short)in_R8;
  keyword._2_1_ = (char)((ulong)in_R8 >> 0x10);
  keyword.numFlags.raw = (char)((ulong)in_R8 >> 0x18);
  keyword.rawLen = (int)((ulong)in_R8 >> 0x20);
  lifetime.info = in_R9;
  lifetime._0_8_ = (in_RSI->super_ExpressionSyntax).super_SyntaxNode.parent;
  slang::syntax::FunctionPrototypeSyntax::FunctionPrototypeSyntax
            (*(FunctionPrototypeSyntax **)&(in_RSI->super_ExpressionSyntax).super_SyntaxNode,keyword
             ,(SyntaxList<slang::syntax::ClassSpecifierSyntax> *)in_RCX->location,lifetime,in_RSI,
             in_RDI,unaff_retaddr);
  return pFVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }